

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

char * __thiscall
google::protobuf::Reflection::GetRawSplit<char>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  OneofDescriptor *pOVar3;
  void *pvVar4;
  char *pcVar5;
  LogMessage *this_00;
  string_view v;
  LogMessage LStack_38;
  
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    pvVar4 = GetSplitField(this,message);
    uVar2 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    bVar1 = FieldDescriptor::is_repeated(field);
    pcVar5 = (char *)((ulong)uVar2 + (long)pvVar4);
    if (bVar1) {
      pcVar5 = *(char **)pcVar5;
    }
    return pcVar5;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x6eb,"!schema_.InRealOneof(field)");
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_38,(char (*) [9])"Field = ");
  pcVar5 = (field->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar5 + 2);
  v._M_str = pcVar5 + ~v._M_len;
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}